

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc.cc
# Opt level: O0

void __thiscall
tchecker::system::loc_t::loc_t
          (loc_t *this,process_id_t pid,loc_id_t id,string *name,attributes_t *attributes)

{
  ulong uVar1;
  invalid_argument *this_00;
  attributes_t *attributes_local;
  string *name_local;
  loc_id_t id_local;
  process_id_t pid_local;
  loc_t *this_local;
  
  this->_pid = pid;
  this->_id = id;
  std::__cxx11::string::string((string *)&this->_name,(string *)name);
  attributes_t::attributes_t(&this->_attributes,attributes);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"empty name");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

loc_t::loc_t(tchecker::process_id_t pid, tchecker::loc_id_t id, std::string const & name,
             tchecker::system::attributes_t const & attributes)
    : _pid(pid), _id(id), _name(name), _attributes(attributes)
{
  if (_name.empty())
    throw std::invalid_argument("empty name");
}